

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O2

Config * jaegertracing::samplers::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  int maxOperations;
  int iVar2;
  char (*in_R8) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> samplingServerURL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  allocator local_6a;
  allocator local_69;
  duration local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  double local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = YAML::Node::IsDefined(configYAML);
  if (bVar1) {
    bVar1 = YAML::Node::IsMap(configYAML);
    if (bVar1) {
      utils::yaml::findOrDefault<std::__cxx11::string,char[5],char[1]>
                (&local_38,(yaml *)configYAML,(Node *)0x1ec7bc,(char (*) [5])0x1f210c,in_R8);
      local_60._M_dataplus._M_p._0_4_ = 0xffffffff;
      local_40 = utils::yaml::findOrDefault<double,char[6],int>
                           (configYAML,(char (*) [6])0x1ec7c9,(int *)&local_60);
      utils::yaml::findOrDefault<std::__cxx11::string,char[18],char[1]>
                (&local_60,(yaml *)configYAML,(Node *)"samplingServerURL",(char (*) [18])0x1f210c,
                 in_R8);
      local_68.__r._0_4_ = 0;
      maxOperations =
           utils::yaml::findOrDefault<int,char[14],int>
                     (configYAML,(char (*) [14])"maxOperations",(int *)&local_68);
      local_68.__r = (ulong)local_68.__r._4_4_ << 0x20;
      iVar2 = utils::yaml::findOrDefault<int,char[24],int>
                        (configYAML,(char (*) [24])"samplingRefreshInterval",(int *)&local_68);
      local_68.__r = (long)iVar2 * 1000000000;
      Config(__return_storage_ptr__,&local_38,local_40,&local_60,maxOperations,&local_68);
      goto LAB_0019a987;
    }
  }
  std::__cxx11::string::string((string *)&local_38,"remote",&local_69);
  std::__cxx11::string::string((string *)&local_60,"http://127.0.0.1:5778/sampling",&local_6a);
  local_68.__r = 60000000000;
  Config(__return_storage_ptr__,&local_38,0.001,&local_60,2000,&local_68);
LAB_0019a987:
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto type =
            utils::yaml::findOrDefault<std::string>(configYAML, "type", "");
        const auto param =
            utils::yaml::findOrDefault<double>(configYAML, "param", -1);
        const auto samplingServerURL = utils::yaml::findOrDefault<std::string>(
            configYAML, "samplingServerURL", "");
        const auto maxOperations =
            utils::yaml::findOrDefault<int>(configYAML, "maxOperations", 0);
        const auto samplingRefreshInterval =
            std::chrono::seconds(utils::yaml::findOrDefault<int>(
                configYAML, "samplingRefreshInterval", 0));
        return Config(type,
                      param,
                      samplingServerURL,
                      maxOperations,
                      samplingRefreshInterval);
    }